

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lookup_string_in_fixed_set.c
# Opt level: O0

void NextPos(uchar **pos,char **key,char **multibyte_start)

{
  long lVar1;
  long lVar2;
  int iVar3;
  long *in_RDX;
  long *in_RSI;
  long *in_RDI;
  
  *in_RDI = *in_RDI + 1;
  if (*in_RDX == 0) {
    iVar3 = GetMultibyteLength(*(char *)*in_RSI);
    if (iVar3 == 0) {
      *in_RSI = *in_RSI + 1;
    }
    else {
      *in_RDX = *in_RSI;
    }
  }
  else {
    *in_RSI = *in_RSI + 1;
    lVar1 = *in_RSI;
    lVar2 = *in_RDX;
    iVar3 = GetMultibyteLength(*(char *)*in_RDX);
    if (lVar1 - lVar2 == (long)iVar3) {
      *in_RDX = 0;
    }
  }
  return;
}

Assistant:

static void NextPos(const unsigned char** pos,
	const char** key,
	const char** multibyte_start)
{
	++*pos;
	if (*multibyte_start) {
		/* Advance key to next byte in multibyte sequence. */
		++*key;
		/* Reset multibyte_start if last byte in multibyte sequence was consumed. */
		if (*key - *multibyte_start == GetMultibyteLength(**multibyte_start))
			*multibyte_start = 0;
	} else {
		if (GetMultibyteLength(**key)) {
			/* Multibyte prefix was matched in the dafsa, start matching multibyte
			 * content in next round. */
			*multibyte_start = *key;
		} else {
			/* Advance key as a single byte character was matched. */
			++*key;
		}
	}
}